

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp __thiscall rapidjson::internal::DiyFp::NormalizeBoundary(DiyFp *this)

{
  DiyFp DVar1;
  DiyFp *this_local;
  DiyFp res;
  
  res.f = this->f;
  res.e = (int)*(undefined8 *)&this->e;
  for (; (res.f & 0x20000000000000) == 0; res.f = res.f << 1) {
    res.e = res.e + -1;
  }
  DVar1.f = res.f << 10;
  DVar1.e = res.e + -10;
  DVar1._12_4_ = 0;
  return DVar1;
}

Assistant:

DiyFp NormalizeBoundary() const {
        DiyFp res = *this;
        while (!(res.f & (kDpHiddenBit << 1))) {
            res.f <<= 1;
            res.e--;
        }
        res.f <<= (kDiySignificandSize - kDpSignificandSize - 2);
        res.e = res.e - (kDiySignificandSize - kDpSignificandSize - 2);
        return res;
    }